

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

uint ON_SubDMeshFragmentGrid::SetQuads
               (uint side_segment_count,uint level_of_detail,uint *quads,size_t quad_capacity,
               size_t quad_stride,uint *sides,size_t side_capacity,size_t side_stride)

{
  uint uVar1;
  byte bVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  if (0xffffffbf < side_segment_count - 0x41) {
    uVar1 = 1;
    do {
      if (uVar1 == side_segment_count) {
        uVar1 = 0;
        if ((level_of_detail != 0 && 1 < side_segment_count) &&
           (uVar1 = level_of_detail,
           side_segment_count >> ((byte)level_of_detail & 0x1f) == 0 || 0x1f < level_of_detail)) {
          uVar7 = 1;
          do {
            uVar1 = uVar7;
            uVar7 = uVar1 * 2;
          } while (uVar1 * 2 < side_segment_count);
        }
        bVar2 = (byte)uVar1;
        iVar8 = 1 << (bVar2 & 0x1f);
        iVar5 = side_segment_count + 1 << (bVar2 & 0x1f);
        bVar2 = bVar2 & 0x1f;
        uVar1 = side_segment_count >> bVar2;
        if (quads != (uint *)0x0 || quad_capacity != 0) {
          if ((quad_stride < 4) || (quad_capacity < uVar1 * uVar1)) goto LAB_00606fec;
          if (side_segment_count >> bVar2 != 0) {
            uVar7 = 0;
            do {
              if (0 < (long)(uVar1 * quad_stride)) {
                puVar6 = quads + uVar1 * quad_stride;
                uVar9 = uVar7 * iVar5;
                uVar4 = uVar9 + iVar5;
                do {
                  *quads = uVar9;
                  quads[3] = uVar4;
                  uVar9 = uVar9 + iVar8;
                  uVar4 = uVar4 + iVar8;
                  quads[1] = uVar9;
                  quads[2] = uVar4;
                  quads = quads + quad_stride;
                } while (quads < puVar6);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != uVar1);
          }
        }
        if (sides == (uint *)0x0 && side_capacity == 0) {
LAB_0060713d:
          return uVar1 * uVar1;
        }
        if ((side_stride != 0) && (uVar1 * 4 + 1 <= side_capacity)) {
          if (side_segment_count >> bVar2 != 0) {
            puVar6 = sides + uVar1;
            uVar7 = 0;
            do {
              *sides = uVar7;
              uVar7 = uVar7 + iVar8;
              sides = sides + side_stride;
            } while (sides < puVar6);
            if (side_segment_count >> bVar2 != 0) {
              puVar6 = sides + uVar1;
              do {
                *sides = uVar7;
                uVar7 = uVar7 + iVar5;
                sides = sides + side_stride;
              } while (sides < puVar6);
              if (side_segment_count >> bVar2 != 0) {
                puVar3 = sides + uVar1;
                puVar6 = puVar3;
                do {
                  *sides = uVar7;
                  uVar7 = uVar7 - iVar8;
                  sides = sides + side_stride;
                  puVar6 = puVar6 + side_stride;
                } while (sides < puVar3);
                if (side_segment_count >> bVar2 != 0) {
                  do {
                    *sides = uVar7;
                    uVar7 = uVar7 - iVar5;
                    sides = sides + side_stride;
                  } while (sides < puVar6);
                }
              }
            }
          }
          *sides = 0;
          goto LAB_0060713d;
        }
        goto LAB_00606fec;
      }
      uVar1 = uVar1 * 2;
    } while (uVar1 <= side_segment_count);
  }
  ON_SubDIncrementErrorCount();
LAB_00606fec:
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDMeshFragmentGrid::SetQuads(
  unsigned int side_segment_count,
  unsigned int level_of_detail,
  unsigned int* quads,
  size_t quad_capacity,
  size_t quad_stride,
  unsigned int* sides,
  size_t side_capacity,
  size_t side_stride
)
{
  if ( false == ON_SubDMeshFragment::SideSegmentCountIsValid(side_segment_count) )
    return ON_SUBD_RETURN_ERROR(0);

  if ( side_segment_count <= 1 )
    level_of_detail = 0;
  else if (level_of_detail > 0)
  {
    if (level_of_detail >= 32 || 1U << level_of_detail > side_segment_count)
    {
      level_of_detail = 1;
      while ( 2*level_of_detail < side_segment_count )
        level_of_detail*= 2;
    }
  }


  const unsigned int side_point_count = (side_segment_count+1);
  const unsigned int P_di = (1 << level_of_detail);
  const unsigned int P_dj = P_di*side_point_count;

  const unsigned int side_quad_count = side_segment_count / P_di;

  if (quad_capacity > 0 || nullptr != quads)
  {
    if ( quad_stride < 4 )
      return ON_SUBD_RETURN_ERROR(0);
    if (side_quad_count*side_quad_count > quad_capacity)
      return ON_SUBD_RETURN_ERROR(0);

    unsigned int* fvi = quads;
    for (unsigned int n = 0; n < side_quad_count; n++)
    {
      unsigned int vi0 = n*P_dj;
      unsigned int vi1 = vi0 + P_dj;
      for (const unsigned int* fvi1 = fvi + quad_stride*side_quad_count; fvi < fvi1; fvi += quad_stride)
      {
        fvi[0] = vi0;
        fvi[3] = vi1;
        vi0 += P_di;
        vi1 += P_di;
        fvi[1] = vi0;
        fvi[2] = vi1;
      }
    }
  }

  if (side_capacity > 0 || nullptr != sides)
  {
    if ( side_stride < 1 )
      return ON_SUBD_RETURN_ERROR(0);
    if (side_capacity < 4*side_quad_count +1 )
      return ON_SUBD_RETURN_ERROR(0);

    unsigned int vi = 0;

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi += P_di;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi += P_dj;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi -= P_di;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi -= P_dj;
    }

    *sides = 0;
  }

  return side_quad_count*side_quad_count;
}